

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.cc
# Opt level: O0

ostream * operator<<(ostream *outputStream,Array *arr)

{
  int iVar1;
  ostream *poVar2;
  uint local_1c;
  int i;
  Array *arr_local;
  ostream *outputStream_local;
  
  for (local_1c = 0; (int)local_1c < arr->theSize; local_1c = local_1c + 1) {
    iVar1 = Array::operator[](arr,local_1c);
    poVar2 = (ostream *)std::ostream::operator<<(outputStream,iVar1);
    std::operator<<(poVar2," ");
  }
  return outputStream;
}

Assistant:

ostream &operator<<(ostream &outputStream, Array &arr) {
    for (int i = 0; i < arr.theSize; i++)
        outputStream << arr[i] << " ";
    return outputStream;
}